

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB
          (LegacyScriptPubKeyMan *this,CPubKey *pubkey,bool internal,WalletBatch *batch)

{
  undefined1 uVar1;
  long lVar2;
  allocator<char> *__a;
  mapped_type *pmVar3;
  byte in_DL;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar4;
  int64_t index;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  CPubKey *in_stack_fffffffffffffe70;
  CKeyPool *in_stack_fffffffffffffe78;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  _Rb_tree_const_iterator<long> in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffea0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffea8;
  char *__s;
  undefined7 in_stack_fffffffffffffeb8;
  char local_e9;
  long local_e8;
  _Base_ptr local_e0;
  undefined1 local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  string local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
             (char *)in_stack_fffffffffffffe90._M_node,in_stack_fffffffffffffe8c,
             SUB41((uint)in_stack_fffffffffffffe88 >> 0x18,0));
  lVar5 = *(long *)(in_RDI + 0x2f0);
  lVar2 = std::numeric_limits<long>::max();
  if (lVar2 <= lVar5) {
    __assert_fail("m_max_keypool_index < std::numeric_limits<int64_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x561,
                  "void wallet::LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB(const CPubKey &, const bool, WalletBatch &)"
                 );
  }
  local_e8 = *(long *)(in_RDI + 0x2f0) + 1;
  *(long *)(in_RDI + 0x2f0) = local_e8;
  CKeyPool::CKeyPool(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     (bool)in_stack_fffffffffffffe6f);
  uVar1 = WalletBatch::WritePool
                    ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     (int64_t)in_stack_fffffffffffffea0,
                     (CKeyPool *)in_stack_fffffffffffffe90._M_node);
  if (((uVar1 ^ 0xff) & 1) == 0) {
    if ((in_DL & 1) == 0) {
      pVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffe78,(value_type_conflict6 *)in_stack_fffffffffffffe70
                        );
      in_stack_fffffffffffffe90 = pVar4.first._M_node;
      local_d8 = pVar4.second;
      in_stack_fffffffffffffe8c = CONCAT13(local_d8,(int3)in_stack_fffffffffffffe8c);
      local_e0 = in_stack_fffffffffffffe90._M_node;
    }
    else {
      pVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffe78,(value_type_conflict6 *)in_stack_fffffffffffffe70
                        );
      local_d0 = (_Base_ptr)pVar4.first._M_node;
      local_c8 = pVar4.second;
    }
    lVar5 = local_e8;
    CPubKey::GetID((CPubKey *)in_stack_fffffffffffffe90._M_node);
    pmVar3 = std::
             map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
             operator[]((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                         *)in_stack_fffffffffffffe90._M_node,
                        (key_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    *pmVar3 = lVar5;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    __a = (allocator<char> *)__cxa_allocate_exception(0x10);
    __s = &local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffeb8),__s,__a);
    std::operator+(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    std::runtime_error::runtime_error((runtime_error *)__a,local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(__a,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB(const CPubKey& pubkey, const bool internal, WalletBatch& batch)
{
    LOCK(cs_KeyStore);
    assert(m_max_keypool_index < std::numeric_limits<int64_t>::max()); // How in the hell did you use so many keys?
    int64_t index = ++m_max_keypool_index;
    if (!batch.WritePool(index, CKeyPool(pubkey, internal))) {
        throw std::runtime_error(std::string(__func__) + ": writing imported pubkey failed");
    }
    if (internal) {
        setInternalKeyPool.insert(index);
    } else {
        setExternalKeyPool.insert(index);
    }
    m_pool_key_to_index[pubkey.GetID()] = index;
}